

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_algoim_K.H
# Opt level: O2

bool __thiscall
amrex::algoim::ImplicitIntegral<3,_3,_amrex::algoim::EBPlane,_amrex::algoim::QuadratureRule,_false>
::prune(ImplicitIntegral<3,_3,_amrex::algoim::EBPlane,_amrex::algoim::QuadratureRule,_false> *this)

{
  bool bVar1;
  int iVar2;
  EBPlane *pEVar3;
  int i;
  int dim;
  long lVar4;
  double dVar5;
  double dVar6;
  GpuArray<double,_3U> mid;
  
  i = 0;
  while( true ) {
    iVar2 = this->psiCount;
    if (iVar2 <= i) break;
    mid.arr[0] = 0.0;
    mid.arr[1] = 0.0;
    mid.arr[2] = 0.0;
    pEVar3 = this->phi;
    dVar5 = 0.0;
    for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
      if ((this->free).arr[lVar4] == true) {
        dVar5 = dVar5 + ABS((pEVar3->norm).arr[lVar4]);
      }
      else {
        mid.arr[lVar4] =
             *(double *)
              (&DAT_006f8e60 +
              (ulong)(((this->psi).arr[i].bits >> ((uint)lVar4 & 0x1f) & 1) == 0) * 8);
      }
    }
    dVar6 = (mid.arr[2] - (pEVar3->cent).arr[2]) * (pEVar3->norm).arr[2] +
            (mid.arr[0] - (pEVar3->cent).arr[0]) * (pEVar3->norm).arr[0] +
            (mid.arr[1] - (pEVar3->cent).arr[1]) * (pEVar3->norm).arr[1];
    if ((dVar5 * 0.4999999999999989 < dVar6) || (dVar6 < -(dVar5 * 0.4999999999999989))) {
      if (((dVar6 < 0.0) || (((this->psi).arr[i].bits & 0x18) == 0)) &&
         ((0.0 < dVar6 || (((this->psi).arr[i].bits & 0x18) == 0x10)))) break;
      this->psiCount = iVar2 + -1;
      bVar1 = (bool)(this->psi).arr[i].bits;
      (this->psi).arr[i].bits = (this->free).arr[(long)iVar2 + 2];
      (this->free).arr[(long)iVar2 + 2] = bVar1;
    }
    else {
      i = i + 1;
    }
  }
  return iVar2 <= i;
}

Assistant:

AMREX_GPU_HOST_DEVICE
    bool prune () noexcept
    {
        static constexpr Real eps = std::numeric_limits<Real>::epsilon();
        static constexpr Real almostone = 1.0-10.*eps;

        for (int i = 0; i < psiCount; )
        {
            GpuArray<Real,N> mid = xrange.midpoint();
            Real dphi_max = 0.0_rt;
            for (int dim = 0; dim < N; ++dim) {
                if (free[dim]) {
                    dphi_max += amrex::Math::abs(phi.grad(dim));
                } else {
                    mid[dim] = xrange(psi[i].side(dim),dim);
                }
            }
            dphi_max *= 0.5*almostone;
            const Real phi_0 = phi(mid);
            bool uniform_sign = (phi_0 > dphi_max) || (phi_0 < -dphi_max);
            if (uniform_sign)
            {
                if ((phi_0 >= 0.0 && psi[i].sign() >= 0) ||
                    (phi_0 <= 0.0 && psi[i].sign() <= 0) )
                {
                    --psiCount;
                    detail::swap(psi[i], psi[psiCount]);
                }
                else {
                    return false;
                }
            }
            else {
                ++i;
            }
        }
        return true;
    }